

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O2

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::line
          (rasterizer_cells_aa<agg::cell_aa> *this,int x1,int y1,int x2,int y2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint y1_00;
  int iVar14;
  int iVar15;
  int iVar16;
  long local_68;
  long local_50;
  
  lVar10 = (long)x2 - (long)x1;
  if (lVar10 - 0x400000U < 0xffffffffff800001) {
    iVar11 = (int)((ulong)((long)x2 + (long)x1) >> 1);
    iVar16 = (int)((ulong)((long)y1 + (long)y2) >> 1);
    line(this,x1,y1,iVar11,iVar16);
    line(this,iVar11,iVar16,x2,y2);
  }
  local_50 = (long)y2;
  local_68 = (long)y1;
  iVar11 = x1 >> 8;
  iVar16 = this->m_min_x;
  if (iVar11 < this->m_min_x) {
    this->m_min_x = iVar11;
    iVar16 = iVar11;
  }
  iVar14 = y1 >> 8;
  iVar8 = this->m_max_x;
  if (this->m_max_x < iVar11) {
    this->m_max_x = iVar11;
    iVar8 = iVar11;
  }
  iVar6 = this->m_min_y;
  if (iVar14 < this->m_min_y) {
    this->m_min_y = iVar14;
    iVar6 = iVar14;
  }
  iVar13 = x2 >> 8;
  iVar7 = this->m_max_y;
  if (this->m_max_y < iVar14) {
    this->m_max_y = iVar14;
    iVar7 = iVar14;
  }
  if (iVar13 < iVar16) {
    this->m_min_x = iVar13;
  }
  iVar16 = y2 >> 8;
  if (iVar8 < iVar13) {
    this->m_max_x = iVar13;
  }
  if (iVar16 < iVar6) {
    this->m_min_y = iVar16;
  }
  if (iVar7 < iVar16) {
    this->m_max_y = iVar16;
  }
  y1_00 = y1 & 0xff;
  set_curr_cell(this,iVar11,iVar14);
  if (iVar14 != iVar16) {
    local_50 = local_50 - local_68;
    if (x2 == x1) {
      iVar8 = (x2 & 0xffU) * 2;
      iVar6 = (uint)(-1 < local_50) * 0x100;
      uVar12 = (uint)(local_50 >> 0x3f) | 1;
      iVar7 = iVar6 - y1_00;
      uVar1 = (this->m_curr_cell).cover;
      uVar3 = (this->m_curr_cell).area;
      (this->m_curr_cell).cover = iVar7 + uVar1;
      (this->m_curr_cell).area = iVar7 * iVar8 + uVar3;
      set_curr_cell(this,iVar11,uVar12 + iVar14);
      iVar7 = (uint)(-1 < local_50) * 0x200 + -0x100;
      for (; iVar16 - uVar12 != iVar14; iVar14 = iVar14 + uVar12) {
        (this->m_curr_cell).cover = iVar7;
        (this->m_curr_cell).area = iVar7 * iVar8;
        set_curr_cell(this,iVar11,iVar14 + uVar12 * 2);
      }
      iVar6 = iVar6 + (y2 | 0xffffff00U);
      uVar2 = (this->m_curr_cell).cover;
      uVar4 = (this->m_curr_cell).area;
      (this->m_curr_cell).cover = iVar6 + uVar2;
      (this->m_curr_cell).area = iVar8 * iVar6 + uVar4;
      return;
    }
    if (local_50 < 0) {
      local_50 = -local_50;
      iVar11 = -1;
      iVar8 = 0;
      uVar12 = y1_00;
    }
    else {
      iVar8 = 0x100;
      iVar11 = 1;
      uVar12 = 0x100 - y1_00;
    }
    iVar6 = (int)((long)((ulong)uVar12 * lVar10) % local_50);
    iVar7 = (iVar6 >> 0x1f) + x1 + (int)((long)((ulong)uVar12 * lVar10) / local_50);
    render_hline(this,iVar14,x1,y1_00,iVar7,iVar8);
    iVar13 = iVar11 + iVar14;
    set_curr_cell(this,iVar7 >> 8,iVar13);
    x1 = iVar7;
    if (iVar13 == iVar16) {
      y1_00 = 0x100 - iVar8;
      iVar14 = iVar16;
    }
    else {
      iVar7 = (int)((lVar10 * 0x100) % local_50);
      iVar5 = (int)local_50;
      iVar9 = iVar7 + iVar5;
      if (-1 < iVar7) {
        iVar9 = iVar7;
      }
      iVar15 = iVar5;
      if (iVar6 < 0) {
        iVar15 = 0;
      }
      iVar6 = iVar6 - iVar15;
      y1_00 = 0x100 - iVar8;
      iVar15 = iVar14 + iVar11 * 2;
      for (; iVar14 = iVar16, iVar16 != iVar13; iVar13 = iVar13 + iVar11) {
        iVar14 = iVar6 + iVar9;
        iVar6 = iVar5;
        if (-1 >= iVar14) {
          iVar6 = 0;
        }
        iVar6 = iVar14 - iVar6;
        iVar14 = (uint)(-1 < iVar14) + (iVar7 >> 0x1f) + (int)((lVar10 * 0x100) / local_50) + x1;
        render_hline(this,iVar13,x1,y1_00,iVar14,iVar8);
        set_curr_cell(this,iVar14 >> 8,iVar15);
        iVar15 = iVar15 + iVar11;
        x1 = iVar14;
      }
    }
  }
  render_hline(this,iVar14,x1,y1_00,x2,y2 & 0xff);
  return;
}

Assistant:

void rasterizer_cells_aa<Cell>::line(int x1, int y1, int x2, int y2)
    {
        enum dx_limit_e { dx_limit = 16384 << poly_subpixel_shift };

        long long dx = (long long)x2 - (long long)x1;

        if(dx >= dx_limit || dx <= -dx_limit)
        {
            int cx = (int)(((long long)x1 + (long long)x2) >> 1);
            int cy = (int)(((long long)y1 + (long long)y2) >> 1);
            line(x1, y1, cx, cy);
            line(cx, cy, x2, y2);
        }

        long long dy = (long long)y2 - (long long)y1;
        int ex1 = x1 >> poly_subpixel_shift;
        int ex2 = x2 >> poly_subpixel_shift;
        int ey1 = y1 >> poly_subpixel_shift;
        int ey2 = y2 >> poly_subpixel_shift;
        int fy1 = y1 & poly_subpixel_mask;
        int fy2 = y2 & poly_subpixel_mask;

        int x_from, x_to;
        int rem, mod, lift, delta, first, incr;
        long long p;

        if(ex1 < m_min_x) m_min_x = ex1;
        if(ex1 > m_max_x) m_max_x = ex1;
        if(ey1 < m_min_y) m_min_y = ey1;
        if(ey1 > m_max_y) m_max_y = ey1;
        if(ex2 < m_min_x) m_min_x = ex2;
        if(ex2 > m_max_x) m_max_x = ex2;
        if(ey2 < m_min_y) m_min_y = ey2;
        if(ey2 > m_max_y) m_max_y = ey2;

        set_curr_cell(ex1, ey1);

        //everything is on a single hline
        if(ey1 == ey2)
        {
            render_hline(ey1, x1, fy1, x2, fy2);
            return;
        }

        //Vertical line - we have to calculate start and end cells,
        //and then - the common values of the area and coverage for
        //all cells of the line. We know exactly there's only one 
        //cell, so, we don't have to call render_hline().
        incr  = 1;
        if(dx == 0)
        {
            int ex = x1 >> poly_subpixel_shift;
            int two_fx = (x1 - (ex << poly_subpixel_shift)) << 1;
            int area;

            first = poly_subpixel_scale;
            if(dy < 0)
            {
                first = 0;
                incr  = -1;
            }

            x_from = x1;

            //render_hline(ey1, x_from, fy1, x_from, first);
            delta = first - fy1;
            m_curr_cell.cover += delta;
            m_curr_cell.area  += two_fx * delta;

            ey1 += incr;
            set_curr_cell(ex, ey1);

            delta = first + first - poly_subpixel_scale;
            area = two_fx * delta;
            while(ey1 != ey2)
            {
                //render_hline(ey1, x_from, poly_subpixel_scale - first, x_from, first);
                m_curr_cell.cover = delta;
                m_curr_cell.area  = area;
                ey1 += incr;
                set_curr_cell(ex, ey1);
            }
            //render_hline(ey1, x_from, poly_subpixel_scale - first, x_from, fy2);
            delta = fy2 - poly_subpixel_scale + first;
            m_curr_cell.cover += delta;
            m_curr_cell.area  += two_fx * delta;
            return;
        }

        //ok, we have to render several hlines
        p     = (poly_subpixel_scale - fy1) * dx;
        first = poly_subpixel_scale;

        if(dy < 0)
        {
            p     = fy1 * dx;
            first = 0;
            incr  = -1;
            dy    = -dy;
        }

        delta = (int)(p / dy);
        mod   = (int)(p % dy);

        if(mod < 0)
        {
            delta--;
            mod += dy;
        }

        x_from = x1 + delta;
        render_hline(ey1, x1, fy1, x_from, first);

        ey1 += incr;
        set_curr_cell(x_from >> poly_subpixel_shift, ey1);

        if(ey1 != ey2)
        {
            p     = poly_subpixel_scale * dx;
            lift  = (int)(p / dy);
            rem   = (int)(p % dy);

            if(rem < 0)
            {
                lift--;
                rem += dy;
            }
            mod -= dy;

            while(ey1 != ey2)
            {
                delta = lift;
                mod  += rem;
                if (mod >= 0)
                {
                    mod -= dy;
                    delta++;
                }

                x_to = x_from + delta;
                render_hline(ey1, x_from, poly_subpixel_scale - first, x_to, first);
                x_from = x_to;

                ey1 += incr;
                set_curr_cell(x_from >> poly_subpixel_shift, ey1);
            }
        }
        render_hline(ey1, x_from, poly_subpixel_scale - first, x2, fy2);
    }